

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spot_light.h
# Opt level: O3

void __thiscall
CMU462::DynamicScene::SpotLight::SpotLight
          (SpotLight *this,LightInfo *light_info,Matrix4x4 *transform)

{
  double dVar1;
  float fVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double local_98;
  double dStack_90;
  double local_88;
  Vector4D local_78;
  Vector4D local_50;
  
  (this->super_SceneLight)._vptr_SceneLight = (_func_int **)&PTR_get_static_light_002773a8;
  (this->spectrum).r = 0.0;
  (this->spectrum).g = 0.0;
  (this->spectrum).b = 0.0;
  (this->direction).x = 0.0;
  (this->direction).y = 0.0;
  (this->direction).z = 0.0;
  (this->position).x = 0.0;
  (this->position).y = 0.0;
  (this->position).z = 0.0;
  (this->spectrum).b = (light_info->spectrum).b;
  fVar2 = (light_info->spectrum).g;
  (this->spectrum).r = (light_info->spectrum).r;
  (this->spectrum).g = fVar2;
  local_78.x = (light_info->position).x;
  local_78.y = (light_info->position).y;
  local_78.z = (light_info->position).z;
  local_78.w = 1.0;
  Matrix4x4::operator*(transform,&local_78);
  Vector4D::to3D(&local_50);
  (this->position).z = local_88;
  (this->position).x = local_98;
  (this->position).y = dStack_90;
  local_78.x = (light_info->direction).x;
  local_78.y = (light_info->direction).y;
  local_78.z = (light_info->direction).z;
  local_78.w = 1.0;
  Matrix4x4::operator*(transform,&local_78);
  Vector4D::to3D(&local_50);
  dVar1 = local_88 - (this->position).z;
  dVar3 = local_98 - (this->position).x;
  dVar4 = dStack_90 - (this->position).y;
  dVar5 = 1.0 / SQRT(dVar1 * dVar1 + dVar3 * dVar3 + dVar4 * dVar4);
  (this->direction).x = dVar5 * dVar3;
  (this->direction).y = dVar5 * dVar4;
  (this->direction).z = dVar1 * dVar5;
  return;
}

Assistant:

SpotLight(const Collada::LightInfo& light_info, const Matrix4x4& transform) {
    this->spectrum = light_info.spectrum;
    this->position = (transform * Vector4D(light_info.position, 1)).to3D();
    this->direction =
        (transform * Vector4D(light_info.direction, 1)).to3D() - position;
    this->direction.normalize();
  }